

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O0

vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
* polyscope::gather<glm::vec<4,unsigned_int,(glm::qualifier)0>>
            (vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
             *input,vector<unsigned_int,_std::allocator<unsigned_int>_> *perm)

{
  anon_union_4_3_4e90b0ec_for_vec<4,_unsigned_int,_(glm::qualifier)0>_5 aVar1;
  anon_union_4_3_4e909a07_for_vec<4,_unsigned_int,_(glm::qualifier)0>_9 aVar2;
  size_type sVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  *in_RSI;
  vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  *in_RDI;
  size_t i;
  vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  *result;
  allocator_type *in_stack_ffffffffffffffa0;
  vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  *this;
  size_type local_38;
  vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
  *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
  if (sVar3 == 0) {
    std::
    vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
    ::vector((vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
              *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  }
  else {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
    this = (vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
            *)&stack0xffffffffffffffe6;
    std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::allocator
              ((allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *)0x430dd7);
    std::
    vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
    ::vector(this,sVar3,in_stack_ffffffffffffffa0);
    std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>::~allocator
              ((allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_> *)0x430df7);
    local_38 = 0;
    while (sVar3 = local_38,
          sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX),
          sVar3 < sVar4) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDX,local_38)
      ;
      pvVar6 = std::
               vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
               ::operator[](in_RSI,(ulong)*pvVar5);
      pvVar7 = std::
               vector<glm::vec<4,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_unsigned_int,_(glm::qualifier)0>_>_>
               ::operator[](in_RDI,local_38);
      aVar1 = pvVar6->field_1;
      pvVar7->field_0 = pvVar6->field_0;
      pvVar7->field_1 = aVar1;
      aVar2 = pvVar6->field_3;
      pvVar7->field_2 = pvVar6->field_2;
      pvVar7->field_3 = aVar2;
      local_38 = local_38 + 1;
    }
  }
  return in_RDI;
}

Assistant:

std::vector<T> gather(const std::vector<T>& input, const std::vector<uint32_t>& perm) {
  // TODO figure out if there's a copy to be avoided here
  if (perm.size() == 0) {
    return input;
  }
  std::vector<T> result(perm.size());
  for (size_t i = 0; i < perm.size(); i++) {
    result[i] = input[perm[i]];
  }
  return result;
}